

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O1

void update_mon_intrinsics(level *lev,monst *mon,obj *obj,boolean on,boolean silently)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  char *str;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  obj *otmp;
  bool bVar10;
  bool bVar11;
  
  if (obj->oclass == '\x02') {
    bVar10 = false;
  }
  else if (obj->oclass == '\x06') {
    bVar10 = objects[obj->otyp].oc_subtyp == '\0';
  }
  else {
    bVar10 = true;
  }
  bVar1 = objects[obj->otyp].oc_oprop;
  uVar6 = obj->oprops;
  if (mon->wormno == '\0') {
    if (((viz_array[mon->my][mon->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((bVar7 = 1, ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (bVar7 = 1, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        ((bVar7 = 1, (viz_array[mon->my][mon->mx] & 1U) == 0 || ((mon->data->mflags3 & 0x200) == 0))
        )))) goto LAB_0028b366;
  }
  else {
    bVar2 = worm_known(lev,mon);
    if (bVar2 == '\0') {
      bVar7 = 1;
      goto LAB_0028b366;
    }
  }
  uVar8 = *(uint *)&mon->field_0x60;
  if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    bVar7 = 1;
    if ((char)uVar8 < '\0') goto LAB_0028b366;
  }
  else {
    bVar7 = 1;
    if (((char)uVar8 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0)) goto LAB_0028b366;
  }
  bVar7 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar8 >> 9) & 1;
LAB_0028b366:
  if ((((ushort)(obj->otyp - 0x54U) < 0x16) &&
      (obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr != (char *)0x0)) &&
     (iVar3 = strncmp(obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr,"gold ",5),
     iVar3 == 0)) {
    if (on == '\0') {
      end_burn(obj,'\0');
    }
    else {
      begin_burn(lev,obj,'\0');
      if ((silently == '\0') && (bVar7 == 0)) {
        str = xname(obj);
        The(str);
        pline("%s begins to glow.");
      }
    }
  }
  uVar8 = 0;
  uVar5 = 0;
  uVar9 = (ulong)bVar1;
  if (bVar1 == 0) goto LAB_0028b567;
  do {
    uVar5 = uVar9;
    bVar2 = in_mklev;
    uVar4 = (uint)uVar5;
    if (on == '\0') {
      if (uVar4 - 1 < 8) {
        in_mklev = bVar2;
        if ((mon->data->mresists >> (uVar4 - 1 & 0x1f) & 1) == 0) {
          for (otmp = mon->minvent; otmp != (obj *)0x0; otmp = otmp->nobj) {
            if ((otmp->owornmask != 0) && (bVar2 = obj_has_prop(otmp,uVar4), bVar2 != '\0'))
            goto LAB_0028b567;
          }
          mon->mintrinsics =
               mon->mintrinsics & (~(ushort)(1 << ((byte)(uVar4 - 1) & 0x1f)) | 0xff00);
        }
      }
      else if (uVar4 == 0x1a) {
LAB_0028b4f7:
        if (silently != '\0') {
          in_mklev = '\x01';
        }
        mon_adjust_speed(mon,0,obj);
        uVar5 = 0x1a;
        in_mklev = bVar2;
      }
      else {
        in_mklev = bVar2;
        if (uVar4 == 0xd) {
          uVar4 = *(uint *)&mon->field_0x60 & 0xfffffffd | *(uint *)&mon->field_0x60 >> 2 & 2;
          goto LAB_0028b55f;
        }
      }
    }
    else if (uVar4 < 0x2f) {
      in_mklev = bVar2;
      if ((0x74e0024c0000U >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 != 0xd) {
          if (uVar5 == 0x1a) goto LAB_0028b4f7;
          goto LAB_0028b48f;
        }
        uVar4 = (*(uint *)&mon->field_0x60 & 0xfffffffd | *(uint *)&mon->field_0x60 >> 1 & 2) ^ 2;
LAB_0028b55f:
        *(uint *)&mon->field_0x60 = uVar4;
        uVar5 = 0xd;
      }
    }
    else {
LAB_0028b48f:
      in_mklev = bVar2;
      if (uVar4 < 9) {
        mon->mintrinsics = mon->mintrinsics | (ushort)(1 << ((char)uVar5 - 1U & 0x1f)) & 0xff;
      }
    }
LAB_0028b567:
    if (obj->otyp == 0x7c) {
      uVar4 = 0;
      if (on == '\0') {
        uVar4 = *(uint *)&mon->field_0x60 >> 2 & 2;
      }
      *(uint *)&mon->field_0x60 =
           uVar4 | (*(uint *)&mon->field_0x60 & 0xfffffff9) + (uint)(on != '\0') * 4;
    }
    do {
      uVar4 = (uint)uVar5;
      if (uVar6 == 0) {
LAB_0028b696:
        if (((on == '\0') && (u.usteed == mon)) && (obj->otyp == 0xf0)) {
          dismount_steed(1);
        }
        if (silently != '\0') {
          return;
        }
        if (mon->wormno == '\0') {
          if (((viz_array[mon->my][mon->mx] & 2U) == 0) &&
             (((((u.uprops[0x1e].intrinsic != 0 ||
                 ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
               ((uVar8 = 1, ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
              (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
                (uVar8 = 1, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
               ((uVar8 = 1, (viz_array[mon->my][mon->mx] & 1U) == 0 ||
                ((mon->data->mflags3 & 0x200) == 0)))))))) goto LAB_0028b802;
        }
        else {
          bVar2 = worm_known(lev,mon);
          if (bVar2 == '\0') {
            uVar8 = 1;
            goto LAB_0028b802;
          }
        }
        uVar4 = *(uint *)&mon->field_0x60;
        if ((((uVar4 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          uVar8 = 1;
          if ((char)uVar4 < '\0') goto LAB_0028b802;
        }
        else {
          uVar8 = 1;
          if (((char)uVar4 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_0028b802;
        }
        uVar8 = 1;
        if ((uVar4 >> 9 & 1) == 0) {
          uVar8 = (uint)u._1052_4_ >> 5 & 1;
        }
LAB_0028b802:
        if (uVar8 == bVar7) {
          return;
        }
        newsym((int)mon->mx,(int)mon->my);
        return;
      }
      do {
        bVar11 = uVar8 == 0;
        uVar8 = uVar8 * 2;
        if (bVar11) {
          uVar8 = 1;
        }
        if (0xfffff < (int)uVar8) goto LAB_0028b696;
      } while ((uVar6 & (long)(int)uVar8) == 0);
      if ((int)uVar8 < 0x20) {
        if ((int)uVar8 < 4) {
          if (uVar8 == 1) {
            if (bVar10) {
              uVar4 = 1;
            }
          }
          else {
            if (uVar8 != 2) {
LAB_0028b678:
              uVar9 = 0;
              goto LAB_0028b67b;
            }
            if (bVar10) {
              uVar4 = 2;
            }
          }
        }
        else {
          if (uVar8 != 4) {
            uVar9 = 0x2a;
            if (uVar8 != 0x10) goto LAB_0028b678;
            goto LAB_0028b67b;
          }
          if (bVar10) {
            uVar4 = 0x35;
          }
        }
        uVar9 = (ulong)uVar4;
      }
      else if ((int)uVar8 < 0x800) {
        if (uVar8 == 0x20) {
          uVar9 = 0x1a;
        }
        else {
          if (uVar8 != 0x400) goto LAB_0028b678;
          uVar9 = 0x19;
        }
      }
      else if (uVar8 == 0x800) {
        uVar9 = 0x2d;
      }
      else if (uVar8 == 0x8000) {
        uVar9 = 0x25;
      }
      else {
        if (uVar8 != 0x80000) goto LAB_0028b678;
        uVar9 = 0x14;
      }
LAB_0028b67b:
      uVar6 = uVar6 & (long)(int)~uVar8;
      uVar5 = 0;
    } while ((int)uVar9 == 0);
  } while( true );
}

Assistant:

void update_mon_intrinsics(struct level *lev, struct monst *mon, struct obj *obj,
			   boolean on, boolean silently)
{
    int unseen;
    uchar mask;
    struct obj *otmp;
    int which = (int) objects[obj->otyp].oc_oprop;
    long props = obj->oprops;
    int p = 0;
    boolean is_weapon = (obj->oclass == WEAPON_CLASS || is_weptool(obj));

    unseen = !canseemon(lev, mon);

    if (Is_gold_dragon_armor(obj->otyp)) {
	if (on)
	    begin_burn(lev, obj, FALSE);
	else
	    end_burn(obj, FALSE);
	if (!unseen && !silently)
	    if (on) pline("%s begins to glow.", The(xname(obj)));
    }

    if (!which) goto maybe_blocks;

 new_property:

    if (on) {
	switch (which) {
	 case INVIS:
	    mon->minvis = !mon->invis_blkd;
	    break;
	 case FAST:
	  {
	    boolean save_in_mklev = in_mklev;
	    if (silently) in_mklev = TRUE;
	    mon_adjust_speed(mon, 0, obj);
	    in_mklev = save_in_mklev;
	    break;
	  }
	/* properties handled elsewhere */
	 case ANTIMAGIC:
	 case REFLECTING:
	    break;
	/* properties which have no effect for monsters */
	 case CLAIRVOYANT:
	 case STEALTH:
	 case TELEPAT:
	    break;
	/* properties which should have an effect but aren't implemented */
	 case LEVITATION:
	 case WWALKING:
	    break;
	/* properties which maybe should have an effect but don't */
	 case DISPLACED:
	 case FUMBLING:
	 case JUMPING:
	 case PROTECTION:
	    break;
	 default:
	    if (which <= 8) {	/* 1 thru 8 correspond to MR_xxx mask values */
		/* FIRE,COLD,SLEEP,DISINT,SHOCK,POISON,ACID,STONE */
		mask = (uchar) (1 << (which - 1));
		mon->mintrinsics |= (unsigned short) mask;
	    }
	    break;
	}
    } else {	    /* off */
	switch (which) {
	 case INVIS:
	    mon->minvis = mon->perminvis;
	    break;
	 case FAST:
	  {
	    boolean save_in_mklev = in_mklev;
	    if (silently) in_mklev = TRUE;
	    mon_adjust_speed(mon, 0, obj);
	    in_mklev = save_in_mklev;
	    break;
	  }
	 case FIRE_RES:
	 case COLD_RES:
	 case SLEEP_RES:
	 case DISINT_RES:
	 case SHOCK_RES:
	 case POISON_RES:
	 case ACID_RES:
	 case STONE_RES:
	    mask = (uchar) (1 << (which - 1));
	    /* If the monster doesn't have this resistance intrinsically,
	       check whether any other worn item confers it.  Note that
	       we don't currently check for anything conferred via simply
	       carrying an object. */
	    if (!(mon->data->mresists & mask)) {
		for (otmp = mon->minvent; otmp; otmp = otmp->nobj)
		    if (otmp->owornmask && obj_has_prop(otmp, which))
			break;
		if (!otmp)
		    mon->mintrinsics &= ~((unsigned short) mask);
	    }
	    break;
	 default:
	    break;
	}
    }

 maybe_blocks:
    /* obj->owornmask has been cleared by this point, so we can't use it.
       However, since monsters don't wield armor, we don't have to guard
       against that and can get away with a blanket worn-mask value. */
    switch (w_blocks(obj,~0L)) {
     case INVIS:
	mon->invis_blkd = on ? 1 : 0;
	mon->minvis = on ? 0 : mon->perminvis;
	break;
     default:
	break;
    }

    /* Repeat most of the above (goto new_property) for each property. */
    while (props) {
	if (p == 0) p = 1;
	else p <<= 1;

	if (p > ITEM_PROP_MASK) break;
	if (!(props & p)) continue;

	props &= ~p;

	switch (p) {
	case ITEM_FIRE:
	    if (!is_weapon) which = FIRE_RES;
	    break;
	case ITEM_FROST:
	    if (!is_weapon) which = COLD_RES;
	    break;
	case ITEM_DRLI:
	    if (!is_weapon) which = DRAIN_RES;
	    break;
	case ITEM_REFLECTION:	which = REFLECTING; break;
	case ITEM_SPEED:	which = FAST; break;
	case ITEM_ESP:		which = TELEPAT; break;
	case ITEM_DISPLACEMENT:	which = DISPLACED; break;
	case ITEM_FUMBLING:	which = FUMBLING; break;
	case ITEM_AGGRAVATE:	which = AGGRAVATE_MONSTER; break;
	default:		which = 0; break;
	}

	if (which) goto new_property;
    }

	if (!on && mon == u.usteed && obj->otyp == SADDLE)
	    dismount_steed(DISMOUNT_FELL);

    /* if couldn't see it but now can, or vice versa, update display */
    if (!silently && (unseen ^ !canseemon(lev, mon)))
	newsym(mon->mx, mon->my);
}